

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O0

int push_inner(mg_context *ctx,FILE *fp,SOCKET sock,SSL *ssl,char *buf,int len,double timeout)

{
  int iVar1;
  size_t sVar2;
  int *piVar3;
  ssize_t sVar4;
  uint64_t uVar5;
  int local_7c;
  SOCKET local_74;
  int pollres;
  pollfd pfd [1];
  uint ms_wait;
  int err;
  int n;
  uint64_t timeout_ns;
  uint64_t now;
  uint64_t start;
  double timeout_local;
  int len_local;
  char *buf_local;
  SSL *ssl_local;
  SOCKET sock_local;
  FILE *fp_local;
  mg_context *ctx_local;
  
  now = 0;
  _err = 0;
  pfd[0].fd = 200;
  if (0.0 < timeout) {
    now = mg_get_current_time_ns();
    _err = (ulong)(timeout * 1000000000.0);
    _err = _err | (long)(timeout * 1000000000.0 - 9.223372036854776e+18) & (long)_err >> 0x3f;
  }
  if (ctx == (mg_context *)0x0) {
    ctx_local._4_4_ = -2;
  }
  else if (ssl == (SSL *)0x0) {
LAB_0012e3b8:
    do {
      if (fp == (FILE *)0x0) {
        sVar4 = send(sock,buf,(long)len,0x4000);
        ms_wait = (uint)sVar4;
        if ((int)ms_wait < 0) {
          piVar3 = __errno_location();
          local_7c = *piVar3;
        }
        else {
          local_7c = 0;
        }
        pfd[0].events = (undefined2)local_7c;
        pfd[0].revents = local_7c._2_2_;
        if (((local_7c == 0xb) || (local_7c == 0xb)) || (local_7c == 4)) {
          pfd[0].events = 0;
          pfd[0].revents = 0;
          ms_wait = 0;
        }
        if ((int)ms_wait < 0) {
          return -2;
        }
      }
      else {
        sVar2 = fwrite(buf,1,(long)len,(FILE *)fp);
        ms_wait = (uint)sVar2;
        iVar1 = ferror((FILE *)fp);
        if (iVar1 == 0) {
          pfd[0].events = 0;
          pfd[0].revents = 0;
        }
        else {
          ms_wait = 0xffffffff;
          piVar3 = __errno_location();
          pfd[0]._4_4_ = *piVar3;
        }
      }
      if (ctx->stop_flag != 0) {
        return -2;
      }
      if ((0 < (int)ms_wait) || ((ms_wait == 0 && (len == 0)))) {
        return ms_wait;
      }
      if ((int)ms_wait < 0) {
        return -2;
      }
      if (fp == (FILE *)0x0) {
        pollres._0_2_ = 4;
        local_74 = sock;
        iVar1 = mg_poll((pollfd *)&stack0xffffffffffffff8c,1,pfd[0].fd,&ctx->stop_flag);
        if (ctx->stop_flag != 0) {
          return -2;
        }
        if (0 < iVar1) goto LAB_0012e3b8;
      }
      else {
        usleep(5000);
      }
    } while ((timeout <= 0.0) || (uVar5 = mg_get_current_time_ns(), uVar5 - now <= _err));
    ctx_local._4_4_ = -1;
  }
  else {
    ctx_local._4_4_ = -2;
  }
  return ctx_local._4_4_;
}

Assistant:

static int
push_inner(struct mg_context *ctx,
           FILE *fp,
           SOCKET sock,
           SSL *ssl,
           const char *buf,
           int len,
           double timeout)
{
	uint64_t start = 0, now = 0, timeout_ns = 0;
	int n, err;
	unsigned ms_wait = SOCKET_TIMEOUT_QUANTUM; /* Sleep quantum in ms */

#if defined(_WIN32)
	typedef int len_t;
#else
	typedef size_t len_t;
#endif

	if (timeout > 0) {
		now = mg_get_current_time_ns();
		start = now;
		timeout_ns = (uint64_t)(timeout * 1.0E9);
	}

	if (ctx == NULL) {
		return -2;
	}

#if defined(NO_SSL) && !defined(USE_MBEDTLS)
	if (ssl) {
		return -2;
	}
#endif

	/* Try to read until it succeeds, fails, times out, or the server
	 * shuts down. */
	for (;;) {

#if defined(USE_MBEDTLS)
		if (ssl != NULL) {
			n = mbed_ssl_write(ssl, (const unsigned char *)buf, len);
			if (n <= 0) {
				if ((n == MBEDTLS_ERR_SSL_WANT_READ)
				    || (n == MBEDTLS_ERR_SSL_WANT_WRITE)
				    || n == MBEDTLS_ERR_SSL_ASYNC_IN_PROGRESS) {
					n = 0;
				} else {
					fprintf(stderr, "SSL write failed, error %d\n", n);
					return -2;
				}
			} else {
				err = 0;
			}
		} else
#elif !defined(NO_SSL)
		if (ssl != NULL) {
			ERR_clear_error();
			n = SSL_write(ssl, buf, len);
			if (n <= 0) {
				err = SSL_get_error(ssl, n);
				if ((err == SSL_ERROR_SYSCALL) && (n == -1)) {
					err = ERRNO;
				} else if ((err == SSL_ERROR_WANT_READ)
				           || (err == SSL_ERROR_WANT_WRITE)) {
					n = 0;
				} else {
					DEBUG_TRACE("SSL_write() failed, error %d", err);
					ERR_clear_error();
					return -2;
				}
				ERR_clear_error();
			} else {
				err = 0;
			}
		} else
#endif

		    if (fp != NULL) {
			n = (int)fwrite(buf, 1, (size_t)len, fp);
			if (ferror(fp)) {
				n = -1;
				err = ERRNO;
			} else {
				err = 0;
			}
		} else {
			n = (int)send(sock, buf, (len_t)len, MSG_NOSIGNAL);
			err = (n < 0) ? ERRNO : 0;
			if (ERROR_TRY_AGAIN(err)) {
				err = 0;
				n = 0;
			}
			if (n < 0) {
				/* shutdown of the socket at client side */
				return -2;
			}
		}

		if (!STOP_FLAG_IS_ZERO(&ctx->stop_flag)) {
			return -2;
		}

		if ((n > 0) || ((n == 0) && (len == 0))) {
			/* some data has been read, or no data was requested */
			return n;
		}
		if (n < 0) {
			/* socket error - check errno */
			DEBUG_TRACE("send() failed, error %d", err);

			/* TODO (mid): error handling depending on the error code.
			 * These codes are different between Windows and Linux.
			 * Currently there is no problem with failing send calls,
			 * if there is a reproducible situation, it should be
			 * investigated in detail.
			 */
			return -2;
		}

		/* Only in case n=0 (timeout), repeat calling the write function */

		/* If send failed, wait before retry */
		if (fp != NULL) {
			/* For files, just wait a fixed time.
			 * Maybe it helps, maybe not. */
			mg_sleep(5);
		} else {
			/* For sockets, wait for the socket using poll */
			struct mg_pollfd pfd[1];
			int pollres;

			pfd[0].fd = sock;
			pfd[0].events = POLLOUT;
			pollres = mg_poll(pfd, 1, (int)(ms_wait), &(ctx->stop_flag));
			if (!STOP_FLAG_IS_ZERO(&ctx->stop_flag)) {
				return -2;
			}
			if (pollres > 0) {
				continue;
			}
		}

		if (timeout > 0) {
			now = mg_get_current_time_ns();
			if ((now - start) > timeout_ns) {
				/* Timeout */
				break;
			}
		}
	}

	(void)err; /* Avoid unused warning if NO_SSL is set and DEBUG_TRACE is not
	           used */

	return -1;
}